

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

bool __thiscall
Js::JavascriptRegExp::GetSetterBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,PropertyValueInfo *info,
          DescriptorFlags *result)

{
  ScriptContext *pSVar1;
  BOOL BVar2;
  ThreadConfiguration *pTVar3;
  byte bVar4;
  DescriptorFlags DVar5;
  PropertyId propertyId_00;
  
  pSVar1 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  switch(propertyId) {
  case 0x1a0:
  case 0x1a3:
  case 0x1a5:
    goto switchD_00d08681_caseD_1a0;
  case 0x1a1:
    goto switchD_00d08681_caseD_1a1;
  case 0x1a2:
    DVar5 = WritableData;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    goto LAB_00d086dd;
  case 0x1a4:
    pTVar3 = (pSVar1->config).threadConfig;
    if (pTVar3->m_ES2018RegExDotAll != true) {
      return false;
    }
    if (pTVar3->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar4 = 1;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      pTVar3 = (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary
                   ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig;
      bVar4 = pTVar3->m_ES2018RegExDotAll;
    }
    if (((bVar4 & 1) == 0) || (pTVar3->m_ES6RegExPrototypeProperties == true)) {
      propertyId_00 = 0x1a4;
LAB_00d087ea:
      BVar2 = DynamicObject::IsWritable(&this->super_DynamicObject,propertyId_00);
      DVar5 = WritableData;
      if (BVar2 != 0) goto LAB_00d086dd;
    }
    break;
  case 0x1a6:
    pTVar3 = (pSVar1->config).threadConfig;
    if (pTVar3->m_ES6Unicode != true) {
      return false;
    }
    if (pTVar3->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar4 = 1;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      pTVar3 = (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary
                   ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig;
      bVar4 = pTVar3->m_ES6Unicode;
    }
    if (((bVar4 & 1) == 0) || (pTVar3->m_ES6RegExPrototypeProperties == true)) {
      propertyId_00 = 0x1a6;
      goto LAB_00d087ea;
    }
    break;
  case 0x1a7:
    pTVar3 = (pSVar1->config).threadConfig;
    if (pTVar3->m_ES6RegExSticky != true) {
      return false;
    }
    if (pTVar3->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar4 = 1;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      pTVar3 = (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary
                   ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig;
      bVar4 = pTVar3->m_ES6RegExSticky;
    }
    if (((bVar4 & 1) == 0) || (pTVar3->m_ES6RegExPrototypeProperties == true)) {
      propertyId_00 = 0x1a7;
      goto LAB_00d087ea;
    }
    break;
  default:
    if ((propertyId != 0x153) && (propertyId != 0x1e0)) {
      return false;
    }
    goto switchD_00d08681_caseD_1a0;
  }
  DVar5 = Data;
LAB_00d086dd:
  *result = DVar5;
  return true;
switchD_00d08681_caseD_1a0:
  if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
switchD_00d08681_caseD_1a1:
    return false;
  }
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  BVar2 = IsWritable(this,propertyId);
  DVar5 = (uint)(BVar2 != 0) * 4 + Data;
  goto LAB_00d086dd;
}

Assistant:

bool JavascriptRegExp::GetSetterBuiltIns(PropertyId propertyId, PropertyValueInfo* info, DescriptorFlags* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define GET_SETTER(ownProperty) \
        if (ownProperty) \
        { \
            PropertyValueInfo::SetNoCache(info, this); \
            *result = JavascriptRegExp::IsWritable(propertyId) ? WritableData : Data; \
            return true; \
        } \
        return false;

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            GET_SETTER(true);
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            GET_SETTER(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            GET_SETTER(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            GET_SETTER(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            GET_SETTER(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return false;
        }

#undef GET_SETTER
    }